

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::AppendCustomCommandSideEffects
          (cmGeneratorTarget *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *sideEffects)

{
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar1;
  cmCustomCommand *pcVar2;
  pointer pAVar3;
  AllConfigSource *source;
  pointer pAVar4;
  cmGeneratorTarget *local_28;
  
  pvVar1 = cmTarget::GetPreBuildCommands(this->Target);
  if ((((pvVar1->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar1->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
        super__Vector_impl_data._M_finish) &&
      (pvVar1 = cmTarget::GetPreLinkCommands(this->Target),
      (pvVar1->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar1->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
      super__Vector_impl_data._M_finish)) &&
     (pvVar1 = cmTarget::GetPostBuildCommands(this->Target),
     (pvVar1->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
     super__Vector_impl_data._M_start ==
     (pvVar1->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    pAVar4 = (this->AllConfigSources).
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (this->AllConfigSources).
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pAVar4 == pAVar3) {
      ComputeAllConfigSources(this);
      pAVar4 = (this->AllConfigSources).
               super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar3 = (this->AllConfigSources).
               super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pAVar4 != pAVar3; pAVar4 = pAVar4 + 1) {
      pcVar2 = cmSourceFile::GetCustomCommand(pAVar4->Source);
      if (pcVar2 != (cmCustomCommand *)0x0) goto LAB_003c744f;
    }
  }
  else {
LAB_003c744f:
    local_28 = this;
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)sideEffects,&local_28);
  }
  return;
}

Assistant:

void cmGeneratorTarget::AppendCustomCommandSideEffects(
  std::set<cmGeneratorTarget const*>& sideEffects) const
{
  if (!this->GetPreBuildCommands().empty() ||
      !this->GetPreLinkCommands().empty() ||
      !this->GetPostBuildCommands().empty()) {
    sideEffects.insert(this);
  } else {
    for (auto const& source : this->GetAllConfigSources()) {
      if (source.Source->GetCustomCommand() != nullptr) {
        sideEffects.insert(this);
        break;
      }
    }
  }
}